

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

int Zyx_ManAddCnfStart(Zyx_Man_t *p)

{
  Bmc_EsPar_t *pBVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int pLits [32];
  int local_a8 [32];
  
  uVar7 = p->pPars->nVars;
  iVar2 = p->nObjs;
  if ((int)uVar7 < iVar2) {
    do {
      uVar3 = 0;
      if (0 < (int)uVar7) {
        iVar8 = p->TopoBase;
        pBVar1 = p->pPars;
        iVar4 = iVar8 * 2;
        uVar3 = 0;
        do {
          iVar5 = uVar7 - pBVar1->nVars;
          if (iVar2 * iVar5 + iVar8 + (int)uVar3 < 0) goto LAB_005aae07;
          local_a8[uVar3] = iVar5 * iVar2 * 2 + iVar4;
          uVar3 = uVar3 + 1;
          iVar4 = iVar4 + 2;
        } while (uVar7 != uVar3);
      }
      if ((int)uVar3 == 0) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                      ,0x297,"int Zyx_ManAddCnfStart(Zyx_Man_t *)");
      }
      iVar2 = bmcg_sat_solver_addclause(p->pSat,local_a8,(int)uVar3);
      if (iVar2 == 0) {
        return 0;
      }
      uVar7 = uVar7 + 1;
      iVar2 = p->nObjs;
    } while ((int)uVar7 < iVar2);
  }
  iVar2 = p->nObjs;
  if (1 < iVar2) {
    iVar8 = 0;
    do {
      pBVar1 = p->pPars;
      iVar4 = pBVar1->nVars;
      uVar3 = 0;
      if (iVar4 < iVar2) {
        iVar5 = p->TopoBase;
        uVar3 = 0;
        do {
          iVar6 = ((iVar4 + (int)uVar3) - pBVar1->nVars) * iVar2 + iVar5 + iVar8;
          if (iVar6 < 0) goto LAB_005aae07;
          local_a8[uVar3] = iVar6 * 2;
          uVar3 = uVar3 + 1;
        } while ((uint)(iVar2 - iVar4) != uVar3);
      }
      if ((int)uVar3 == 0) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                      ,0x2a2,"int Zyx_ManAddCnfStart(Zyx_Man_t *)");
      }
      iVar2 = bmcg_sat_solver_addclause(p->pSat,local_a8,(int)uVar3);
      if (iVar2 == 0) {
        return 0;
      }
      iVar8 = iVar8 + 1;
      iVar2 = p->nObjs;
    } while (iVar8 < iVar2 + -1);
  }
  if ((p->pPars->nLutSize == 2) && (iVar2 = p->pPars->nVars, iVar2 < p->nObjs)) {
    do {
      iVar8 = 3;
      do {
        iVar4 = p->LutMask + 1;
        pBVar1 = p->pPars;
        iVar5 = (iVar2 - pBVar1->nVars) * iVar4;
        if (iVar5 < -1) goto LAB_005aae07;
        local_a8[0] = (uint)(iVar8 == 2) + iVar5 * 2 + 2;
        iVar5 = (iVar2 - pBVar1->nVars) * iVar4;
        if (iVar5 < -2) goto LAB_005aae07;
        local_a8[1] = (uint)(iVar8 == 1) + iVar5 * 2 + 4;
        iVar4 = (iVar2 - pBVar1->nVars) * iVar4;
        if (iVar4 < -3) goto LAB_005aae07;
        local_a8[2] = (iVar8 != 3) + 6 + iVar4 * 2;
        iVar4 = bmcg_sat_solver_addclause(p->pSat,local_a8,3);
        if (iVar4 == 0) {
          return 0;
        }
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      pBVar1 = p->pPars;
      if (pBVar1->fOnlyAnd != 0) {
        iVar8 = p->LutMask + 1;
        iVar4 = (iVar2 - pBVar1->nVars) * iVar8;
        if (iVar4 < -1) {
LAB_005aae07:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        local_a8[0] = iVar4 * 2 + 3;
        iVar4 = (iVar2 - pBVar1->nVars) * iVar8;
        if (iVar4 < -2) goto LAB_005aae07;
        local_a8[1] = iVar4 * 2 + 5;
        iVar8 = (iVar2 - pBVar1->nVars) * iVar8;
        if (iVar8 < -3) goto LAB_005aae07;
        local_a8[2] = iVar8 * 2 + 6;
        iVar8 = bmcg_sat_solver_addclause(p->pSat,local_a8,3);
        if (iVar8 == 0) {
          return 0;
        }
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < p->nObjs);
  }
  return 1;
}

Assistant:

int Zyx_ManAddCnfStart( Zyx_Man_t * p )
{
    // nodes have fanins
    int i, k, pLits[MAJ3_OBJS];
    //printf( "Adding initial clauses:\n" );
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        int nLits = 0;
        for ( k = 0; k < i; k++ )
            pLits[nLits++] = Abc_Var2Lit( Zyx_TopoVar(p, i, k), 0 );
        assert( nLits > 0 );
        if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
            return 0;
    }
 
    // nodes have fanouts
    for ( k = 0; k < p->nObjs-1; k++ )
    {
        int nLits = 0;
        for ( i = p->pPars->nVars; i < p->nObjs; i++ )
            pLits[nLits++] = Abc_Var2Lit( Zyx_TopoVar(p, i, k), 0 );
        assert( nLits > 0 );
        if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
            return 0;
    }
 
    // two input functions
    if ( p->pPars->nLutSize != 2 )
        return 1;
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 3; k++ )
        {
            pLits[0] = Abc_Var2Lit( Zyx_FuncVar(p, i, 1), k==1 );
            pLits[1] = Abc_Var2Lit( Zyx_FuncVar(p, i, 2), k==2 );
            pLits[2] = Abc_Var2Lit( Zyx_FuncVar(p, i, 3), k!=0 );
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, 3 ) )
                return 0;
        }
        if ( p->pPars->fOnlyAnd )
        {
            pLits[0] = Abc_Var2Lit( Zyx_FuncVar(p, i, 1), 1 );
            pLits[1] = Abc_Var2Lit( Zyx_FuncVar(p, i, 2), 1 );
            pLits[2] = Abc_Var2Lit( Zyx_FuncVar(p, i, 3), 0 );
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, 3 ) )
                return 0;
        }
    }
    return 1;
}